

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void units::reduce_number_length(string *unit_string,char detect)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  string *psVar8;
  char cVar9;
  size_t length;
  ulong uVar10;
  bool bVar11;
  
  if ((reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   zstring_abi_cxx11_), iVar3 != 0)) {
    reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_._M_dataplus._M_p =
         (pointer)&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,
               "00000","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_);
  }
  if ((reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   nstring_abi_cxx11_), iVar3 != 0)) {
    reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_._M_dataplus._M_p =
         (pointer)&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,
               "99999","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_);
  }
  psVar8 = &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_;
  if (detect == '0') {
    psVar8 = &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_;
  }
  uVar4 = std::__cxx11::string::find((char *)unit_string,(ulong)(psVar8->_M_dataplus)._M_p,0);
  if (uVar4 != 0xffffffffffffffff) {
    do {
      uVar10 = uVar4 + 5;
      cVar9 = (char)unit_string;
      uVar5 = std::__cxx11::string::find_first_not_of(cVar9,(ulong)(uint)(int)detect);
      if (uVar5 == 0xffffffffffffffff) {
        if (detect != '9') {
          uVar10 = unit_string->_M_string_length;
          uVar5 = std::__cxx11::string::rfind(cVar9,0x2e);
          if (uVar5 != 0xffffffffffffffff) {
            uVar6 = uVar4 - 1;
            pcVar2 = (unit_string->_M_dataplus)._M_p;
            if (uVar5 == uVar6) {
              do {
                do {
                  uVar7 = uVar5;
                  uVar5 = 0;
                } while (uVar7 == 0);
                cVar9 = pcVar2[uVar7 - 1];
                bVar11 = (byte)(cVar9 - 0x30U) < 10;
                uVar4 = uVar6;
                if (!bVar11) goto LAB_0018ab0e;
                uVar5 = uVar7 - 1;
              } while (cVar9 == '0');
              bVar11 = true;
            }
            else {
              do {
                uVar5 = uVar5 + 1;
                bVar11 = uVar4 <= uVar5;
                if (bVar11) goto LAB_0018ab0e;
              } while ((byte)(pcVar2[uVar5] - 0x30U) < 10);
              bVar11 = false;
            }
LAB_0018ab0e:
            if (bVar11) {
              length = ~uVar4;
              goto LAB_0018ab52;
            }
          }
        }
      }
      else {
        uVar10 = uVar5 + 1;
        pcVar2 = (unit_string->_M_dataplus)._M_p;
        cVar1 = pcVar2[uVar5];
        if (((cVar1 != '.') &&
            (((9 < (byte)(cVar1 - 0x30U) ||
              ((uVar10 < unit_string->_M_string_length &&
               (uVar5 = uVar10, 9 < (byte)(pcVar2[uVar10] - 0x30U))))) &&
             (uVar6 = std::__cxx11::string::rfind(cVar9,0x2e), uVar6 != 0xffffffffffffffff)))) &&
           (0xc < uVar5 - uVar6)) {
          uVar7 = uVar4 - 1;
          pcVar2 = (unit_string->_M_dataplus)._M_p;
          if (uVar6 == uVar7) {
            do {
              uVar4 = uVar7;
              if ((uVar6 == 0) || (cVar9 = pcVar2[uVar6 - 1], 9 < (byte)(cVar9 - 0x30U))) {
                bVar11 = false;
                goto LAB_0018ab42;
              }
              uVar6 = uVar6 - 1;
            } while (cVar9 == '0');
            bVar11 = true;
          }
          else {
            do {
              uVar6 = uVar6 + 1;
              bVar11 = uVar4 <= uVar6;
              if (bVar11) goto LAB_0018ab42;
            } while ((byte)(pcVar2[uVar6] - 0x30U) < 10);
            bVar11 = false;
          }
LAB_0018ab42:
          if (bVar11) {
            length = uVar5 - uVar4;
LAB_0018ab52:
            shorten_number(unit_string,uVar4,length);
            uVar10 = uVar4 + 1;
          }
        }
      }
      uVar4 = std::__cxx11::string::find
                        ((char *)unit_string,(ulong)(psVar8->_M_dataplus)._M_p,uVar10);
    } while (uVar4 != 0xffffffffffffffff);
  }
  return;
}

Assistant:

static void reduce_number_length(std::string& unit_string, char detect)
{
    static const std::string zstring("00000");
    static const std::string nstring("99999");
    const std::string& detseq(detect == '0' ? zstring : nstring);
    // search for a bunch of zeros in a row
    std::size_t indexingloc{0};

    auto zloc = unit_string.find(detseq);
    while (zloc != std::string::npos) {
        auto nloc = unit_string.find_first_not_of(detect, zloc + 5);
        indexingloc = zloc + 5;
        if (nloc != std::string::npos) {
            indexingloc = nloc + 1;
            if (unit_string[nloc] != '.') {
                if (!isDigitCharacter(unit_string[nloc]) ||
                    (unit_string.size() > nloc + 1 &&
                     !isDigitCharacter(unit_string[nloc + 1]))) {
                    if (isDigitCharacter(unit_string[nloc])) {
                        ++nloc;
                    }

                    auto dloc = unit_string.find_last_of('.', zloc);

                    if (dloc != std::string::npos && nloc - dloc > 12) {
                        bool valid = true;
                        if (dloc == zloc - 1) {
                            --zloc;
                            auto ploc = dloc;
                            valid = false;
                            while (true) {
                                if (ploc <= 0) {
                                    break;
                                }
                                --ploc;
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    break;
                                }
                                if (unit_string[ploc] != '0') {
                                    valid = true;
                                    break;
                                }
                            }
                        } else {
                            auto ploc = dloc + 1;
                            while (ploc < zloc) {
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    valid = false;
                                    break;
                                }
                                ++ploc;
                            }
                        }
                        if (valid) {
                            shorten_number(unit_string, zloc, nloc - zloc);
                            indexingloc = zloc + 1;
                        }
                    }
                }
            }
        } else if (detect != '9') {
            indexingloc = unit_string.size();
            auto dloc = unit_string.find_last_of('.', zloc);

            if (dloc != std::string::npos) {
                bool valid = true;
                if (dloc == zloc - 1) {
                    --zloc;
                    auto ploc = dloc;
                    valid = false;
                    while (true) {
                        if (ploc > 0) {
                            --ploc;
                            if (!isDigitCharacter(unit_string[ploc])) {
                                break;
                            }
                            if (unit_string[ploc] != '0') {
                                valid = true;
                                break;
                            }
                        }
                    }
                } else {
                    auto ploc = dloc + 1;
                    while (ploc < zloc) {
                        if (!isDigitCharacter(unit_string[ploc])) {
                            valid = false;
                            break;
                        }
                        ++ploc;
                    }
                }
                if (valid) {
                    shorten_number(unit_string, zloc, nloc - zloc);
                    indexingloc = zloc + 1;
                }
            }
        }
        zloc = unit_string.find(detseq, indexingloc);
    }
}